

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfile.cpp
# Opt level: O1

void __thiscall LogFile::GetFileName(LogFile *this,time_t nowTime,string *sLogName)

{
  char *__s;
  tm *__tp;
  size_type __maxsize;
  time_t local_18;
  
  local_18 = nowTime;
  __tp = gmtime(&local_18);
  std::__cxx11::string::resize((ulong)sLogName,'\x13');
  __s = (sLogName->_M_dataplus)._M_p;
  __maxsize = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__s != &sLogName->field_2) {
    __maxsize = (sLogName->field_2)._M_allocated_capacity;
  }
  strftime(__s,__maxsize,"%Y%m%d-%H%M%S.log",__tp);
  return;
}

Assistant:

void LogFile::GetFileName(time_t nowTime, std::string & sLogName)
{
	struct tm * stTime = gmtime(&nowTime);
	sLogName.resize(19);
	strftime(const_cast<char *> (sLogName.data()), sLogName.capacity(), "%Y%m%d-%H%M%S.log", stTime);
}